

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void __thiscall Assimp::JSONWriter::JSONWriter(JSONWriter *this,IOStream *out,uint flags)

{
  locale local_40 [8];
  locale local_38 [8];
  
  this->out = out;
  (this->indent)._M_dataplus._M_p = (pointer)&(this->indent).field_2;
  (this->indent)._M_string_length = 0;
  (this->indent).field_2._M_local_buf[0] = '\0';
  (this->newline)._M_dataplus._M_p = (pointer)&(this->newline).field_2;
  (this->newline)._M_string_length = 0;
  (this->newline).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&this->buff);
  this->first = false;
  this->flags = flags;
  std::locale::locale(local_40,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale(local_40);
  return;
}

Assistant:

JSONWriter(Assimp::IOStream& out, unsigned int flags = 0u)
    : out(out)
    , first()
    , flags(flags) {
        // make sure that all formatting happens using the standard, C locale and not the user's current locale
        buff.imbue(std::locale("C"));
    }